

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.hpp
# Opt level: O0

uint32_t crc32_0x04C11DB7<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          last,uint32_t initial)

{
  uint uVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  uVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_int,crc32_0x04C11DB7<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_int)::_lambda(unsigned_int&,char_const&)_1_>
                    (in_RDI,in_RSI,in_EDX);
  return uVar1;
}

Assistant:

inline uint32_t crc32_0x04C11DB7(InputIt first, InputIt last, uint32_t initial)
{
	typedef typename std::iterator_traits<InputIt>::value_type ValueType;

	return std::accumulate(
		first, last,
		initial,
		[](uint32_t& crc, const ValueType& data) -> uint32_t {
			const uint8_t byte = data & 0xFF;
			crc = (crc << 8) ^ g_crc32_0x04C11DB7[(crc >> 24) ^ byte];
			return crc;
		}
	);
}